

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

nng_err nni_http_copy_body(nng_http *conn,void *data,size_t size)

{
  nng_err local_24;
  nng_err rv;
  size_t size_local;
  void *data_local;
  nng_http *conn_local;
  
  if ((conn->client & 1U) == 0) {
    local_24 = http_copy_data(&(conn->res).data,data,size);
  }
  else {
    local_24 = http_copy_data(&(conn->req).data,data,size);
  }
  if (local_24 == NNG_OK) {
    nni_http_set_content_length(conn,size);
  }
  return local_24;
}

Assistant:

nng_err
nni_http_copy_body(nng_http *conn, const void *data, size_t size)
{
	nng_err rv;
	if (conn->client) {
		rv = http_copy_data(&conn->req.data, data, size);
	} else {
		rv = http_copy_data(&conn->res.data, data, size);
	}
	if (rv == NNG_OK) {
		nni_http_set_content_length(conn, size);
	}
	return (rv);
}